

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::handleNonExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,AssertionReaction *reaction)

{
  size_type *psVar1;
  size_type *psVar2;
  ulong uVar3;
  char *pcVar4;
  size_type sVar5;
  char *pcVar6;
  size_t sVar7;
  size_type sVar8;
  int iVar9;
  bool bVar10;
  undefined1 local_118 [8];
  AssertionResult assertionResult;
  AssertionResultData data;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar4 = (info->macroName).m_start;
  sVar5 = (info->macroName).m_size;
  pcVar6 = (info->lineInfo).file;
  sVar7 = (info->lineInfo).line;
  sVar8 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar8;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar6;
  (this->m_lastAssertionInfo).lineInfo.line = sVar7;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar4;
  (this->m_lastAssertionInfo).macroName.m_size = sVar5;
  psVar1 = &data.message._M_string_length;
  data.message._M_dataplus._M_p = (pointer)0x0;
  data.message._M_string_length._0_1_ = 0;
  psVar2 = &data.reconstructedExpression._M_string_length;
  data.reconstructedExpression._M_dataplus._M_p = (pointer)0x0;
  data.reconstructedExpression._M_string_length._0_1_ = 0;
  data.reconstructedExpression.field_2._8_8_ = 0;
  data.lazyExpression.m_transientExpression._0_1_ = 0;
  assertionResult.m_resultData._80_8_ = psVar1;
  data.message.field_2._8_8_ = psVar2;
  data.lazyExpression._8_4_ = resultType;
  AssertionResult::AssertionResult
            ((AssertionResult *)local_118,info,
             (AssertionResultData *)&assertionResult.m_resultData.resultType);
  assertionEnded(this,(AssertionResult *)local_118);
  if (((assertionResult.m_resultData.lazyExpression.m_isNegated & 0x10U) != 0) &&
     (((uint)assertionResult.m_info.capturedExpression.m_size & 8) == 0)) {
    iVar9 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[6])();
    reaction->shouldDebugBreak = SUB41(iVar9,0);
    uVar3 = (this->m_totals).assertions.failed;
    iVar9 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[9])();
    bVar10 = true;
    if (uVar3 < (ulong)(long)iVar9) {
      bVar10 = (bool)((char)(this->m_lastAssertionInfo).resultDisposition & Normal);
    }
    reaction->shouldThrow = bVar10;
  }
  if ((size_type *)assertionResult.m_resultData.message.field_2._8_8_ !=
      &assertionResult.m_resultData.reconstructedExpression._M_string_length) {
    operator_delete((void *)assertionResult.m_resultData.message.field_2._8_8_,
                    assertionResult.m_resultData.reconstructedExpression._M_string_length + 1);
  }
  if ((size_type *)assertionResult.m_info._48_8_ !=
      &assertionResult.m_resultData.message._M_string_length) {
    operator_delete((void *)assertionResult.m_info._48_8_,
                    assertionResult.m_resultData.message._M_string_length + 1);
  }
  if ((size_type *)data.message.field_2._8_8_ != psVar2) {
    operator_delete((void *)data.message.field_2._8_8_,
                    CONCAT71(data.reconstructedExpression._M_string_length._1_7_,
                             (undefined1)data.reconstructedExpression._M_string_length) + 1);
  }
  if ((size_type *)assertionResult.m_resultData._80_8_ != psVar1) {
    operator_delete((void *)assertionResult.m_resultData._80_8_,
                    CONCAT71(data.message._M_string_length._1_7_,
                             (undefined1)data.message._M_string_length) + 1);
  }
  return;
}

Assistant:

void RunContext::handleNonExpr(
        AssertionInfo const& info,
        ResultWas::OfType resultType,
        AssertionReaction& reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data(resultType, LazyExpression(false));
        AssertionResult assertionResult{ info, data };
        assertionEnded(assertionResult);

        if (!assertionResult.isOk())
            populateReaction(reaction);
    }